

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O2

void __thiscall
sf::RenderTarget::setupDraw(RenderTarget *this,bool useVertexCache,RenderStates *states)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  PFNGLENABLEPROC *pp_Var4;
  Uint64 UVar5;
  socklen_t extraout_EDX;
  socklen_t extraout_EDX_00;
  socklen_t extraout_EDX_01;
  socklen_t __len;
  Texture *texture;
  RenderTarget *this_00;
  
  this_00 = this;
  if ((this->m_cache).enable == false) {
    iVar3 = (*this->_vptr_RenderTarget[3])(this);
    if ((char)iVar3 == '\0') {
      pp_Var4 = &sf_glad_glDisable;
    }
    else {
      pp_Var4 = &sf_glad_glEnable;
    }
    this_00 = (RenderTarget *)0x8db9;
    (**pp_Var4)(0x8db9);
  }
  if ((this->m_cache).glStatesSet == false) {
    this_00 = this;
    resetGLStates(this);
  }
  if (useVertexCache) {
    if (((this->m_cache).enable != true) || ((this->m_cache).useVertexCache == false)) {
      (*sf_glad_glLoadIdentity)();
    }
  }
  else {
    applyTransform(this_00,(Transform *)(states + 0x18));
  }
  if (((this->m_cache).enable != true) || (bVar1 = 1, (this->m_cache).viewChanged == true)) {
    applyCurrentView(this);
    bVar1 = (this->m_cache).enable;
  }
  if ((bVar1 & 1) == 0) {
LAB_001996b3:
    applyBlendMode(this,(BlendMode *)states);
    __len = extraout_EDX_00;
  }
  else {
    bVar2 = sf::operator!=((BlendMode *)states,&(this->m_cache).lastBlendMode);
    __len = extraout_EDX;
    if (bVar2) goto LAB_001996b3;
  }
  texture = *(Texture **)(states + 0x58);
  if ((this->m_cache).enable == true) {
    if (texture == (Texture *)0x0) {
      UVar5 = 0;
    }
    else {
      if (texture->m_fboAttachment != false) goto LAB_001996e8;
      UVar5 = texture->m_cacheId;
    }
    if (UVar5 == (this->m_cache).lastTextureId) goto LAB_001996f0;
  }
LAB_001996e8:
  applyTexture(this,texture);
  __len = extraout_EDX_01;
LAB_001996f0:
  if (*(long *)(states + 0x60) != 0) {
    Shader::bind((int)*(long *)(states + 0x60),(sockaddr *)texture,__len);
    return;
  }
  return;
}

Assistant:

void RenderTarget::setupDraw(bool useVertexCache, const RenderStates& states)
{
    // Enable or disable sRGB encoding
    // This is needed for drivers that do not check the format of the surface drawn to before applying sRGB conversion
    if (!m_cache.enable)
    {
        if (isSrgb())
            glCheck(glEnable(GL_FRAMEBUFFER_SRGB));
        else
            glCheck(glDisable(GL_FRAMEBUFFER_SRGB));
    }

    // First set the persistent OpenGL states if it's the very first call
    if (!m_cache.glStatesSet)
        resetGLStates();

    if (useVertexCache)
    {
        // Since vertices are transformed, we must use an identity transform to render them
        if (!m_cache.enable || !m_cache.useVertexCache)
            glCheck(glLoadIdentity());
    }
    else
    {
        applyTransform(states.transform);
    }

    // Apply the view
    if (!m_cache.enable || m_cache.viewChanged)
        applyCurrentView();

    // Apply the blend mode
    if (!m_cache.enable || (states.blendMode != m_cache.lastBlendMode))
        applyBlendMode(states.blendMode);

    // Apply the texture
    if (!m_cache.enable || (states.texture && states.texture->m_fboAttachment))
    {
        // If the texture is an FBO attachment, always rebind it
        // in order to inform the OpenGL driver that we want changes
        // made to it in other contexts to be visible here as well
        // This saves us from having to call glFlush() in
        // RenderTextureImplFBO which can be quite costly
        // See: https://www.khronos.org/opengl/wiki/Memory_Model
        applyTexture(states.texture);
    }
    else
    {
        Uint64 textureId = states.texture ? states.texture->m_cacheId : 0;
        if (textureId != m_cache.lastTextureId)
            applyTexture(states.texture);
    }

    // Apply the shader
    if (states.shader)
        applyShader(states.shader);
}